

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.hpp
# Opt level: O1

void __thiscall Lib::Deque<Kernel::TermList>::expand(Deque<Kernel::TermList> *this)

{
  ulong uVar1;
  long lVar2;
  undefined8 *puVar3;
  void *pvVar4;
  ulong uVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  lVar2 = *(long *)this;
  uVar5 = *(ulong *)(this + 0x10);
  lVar8 = 0;
  if (*(ulong *)(this + 0x18) < uVar5) {
    lVar8 = lVar2;
  }
  uVar1 = *(ulong *)(this + 0x18) + lVar8 * 8;
  uVar9 = lVar2 * 0x10;
  if (uVar9 == 0) {
    pvVar4 = FixedSizeAllocator<8UL>::alloc
                       ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar9 < 0x11) {
    pvVar4 = FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar9 < 0x19) {
    pvVar4 = FixedSizeAllocator<24UL>::alloc
                       ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar9 < 0x21) {
    pvVar4 = FixedSizeAllocator<32UL>::alloc
                       ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar9 < 0x31) {
    pvVar4 = FixedSizeAllocator<48UL>::alloc
                       ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar9 < 0x41) {
    pvVar4 = FixedSizeAllocator<64UL>::alloc
                       ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pvVar4 = ::operator_new(uVar9,0x10);
  }
  lVar8 = (long)(uVar1 - uVar5) >> 3;
  if (uVar1 != uVar5) {
    puVar6 = *(undefined8 **)(this + 0x10);
    puVar3 = *(undefined8 **)(this + 0x20);
    lVar7 = 0;
    do {
      *(undefined8 *)((long)pvVar4 + lVar7 * 8) = *puVar6;
      puVar6 = puVar6 + 1;
      if (puVar6 == puVar3) {
        puVar6 = *(undefined8 **)(this + 8);
      }
      lVar7 = lVar7 + 1;
    } while (lVar8 + (ulong)(lVar8 == 0) != lVar7);
  }
  puVar6 = *(undefined8 **)(this + 8);
  if (puVar6 != (undefined8 *)0x0) {
    uVar5 = *(long *)this * 8 + 0xfU & 0xfffffffffffffff0;
    if (uVar5 == 0) {
      *puVar6 = GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = puVar6;
    }
    else if (uVar5 < 0x11) {
      *puVar6 = GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = puVar6;
    }
    else if (uVar5 < 0x19) {
      *puVar6 = GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = puVar6;
    }
    else if (uVar5 < 0x21) {
      *puVar6 = GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = puVar6;
    }
    else if (uVar5 < 0x31) {
      *puVar6 = GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = puVar6;
    }
    else if (uVar5 < 0x41) {
      *puVar6 = GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
      GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = puVar6;
    }
    else {
      operator_delete(puVar6,0x10);
    }
  }
  *(void **)(this + 8) = pvVar4;
  *(void **)(this + 0x10) = pvVar4;
  *(void **)(this + 0x18) = (void *)((long)pvVar4 + lVar8 * 8);
  *(void **)(this + 0x20) = (void *)(uVar9 + (long)pvVar4);
  *(long *)this = lVar2 * 2;
  return;
}

Assistant:

void expand ()
  {
    ASS(shouldExpand());

    size_t curSize=size();
    size_t newCapacity = 2 * _capacity;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),"Deque<>");

    C* newData = static_cast<C*>(mem);
    C* oldPtr=_front;
    for(size_t i = 0; i<curSize; i++) {
      ::new (newData+i) C(*oldPtr);
      oldPtr->~C();

      oldPtr++;
      if(oldPtr==_end) {
	oldPtr=_data;
      }
    }
    ASS_EQ(oldPtr, _back);
    // deallocate the old stack
    DEALLOC_KNOWN(_data,_capacity*sizeof(C),"Deque<>");

    _data = newData;
    _front = _data;
    _back = _data + curSize;
    _end = _data + newCapacity;
    _capacity = newCapacity;
  }